

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  Logic_error *this_00;
  char *pcVar3;
  undefined4 in_register_00000034;
  undefined8 in_XMM0_Qa;
  allocator local_a9;
  undefined8 local_a8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar1 = this->stmt_;
  local_a8 = in_XMM0_Qa;
  iVar2 = bind_parameter_index(this,(string *)CONCAT44(in_register_00000034,__fd));
  iVar2 = sqlite3_bind_double(local_a8,psVar1,iVar2);
  if (iVar2 == 0) {
    return iVar2;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_80,"Error binding ",(string *)CONCAT44(in_register_00000034,__fd));
  std::operator+(&local_60,&local_80,": ");
  pcVar3 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_40,&local_60,pcVar3);
  pcVar3 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_a0,pcVar3,&local_a9);
  Logic_error::Logic_error(this_00,&local_40,&local_a0,iVar2,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const double val)
    {
        int status = sqlite3_bind_double(stmt_, bind_parameter_index(name), val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }